

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglxintegration.cpp
# Opt level: O0

void __thiscall
QGLXContext::QGLXContext
          (QGLXContext *this,Display *display,QXcbScreen *screen,QSurfaceFormat *format,
          QPlatformOpenGLContext *share)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  GLXContext p_Var9;
  __GLXFBConfigRec *dpy;
  char *pcVar10;
  int *piVar11;
  qsizetype qVar12;
  reference piVar13;
  ulong uVar14;
  pointer piVar15;
  QSurfaceFormat *pQVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  QSurfaceFormat *in_RCX;
  undefined8 in_RSI;
  QPlatformOpenGLContext *in_RDI;
  QGLXContext *in_R8;
  long in_FS_OFFSET;
  GLXDrawable prevDrawable;
  GLXContext prevContext;
  int flags;
  int minorVersion;
  int majorVersion;
  int version;
  int i;
  int requestedVersion;
  bool supportsVideoMemoryPurge;
  bool supportsRobustness;
  bool supportsProfiles;
  glXCreateContextAttribsARBProc glXCreateContextAttribsARB;
  Window window;
  XVisualInfo *visualInfo;
  GLXFBConfig config;
  QList<int> contextAttributesWithRobustness;
  QList<int> contextAttributes;
  QList<int> glVersions;
  QByteArrayList glxExt;
  undefined4 in_stack_fffffffffffffdd8;
  parameter_type in_stack_fffffffffffffddc;
  QListSpecialMethodsBase<QByteArray> *in_stack_fffffffffffffde0;
  QSurfaceFormat *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined8 in_stack_fffffffffffffdf8;
  _XDisplay *p_Var19;
  GLXFBConfig config_00;
  Window in_stack_fffffffffffffe20;
  __GLXFBConfigRec *p_Var20;
  undefined8 in_stack_fffffffffffffe28;
  code *pcVar21;
  XVisualInfo *in_stack_fffffffffffffe30;
  Display *in_stack_fffffffffffffe38;
  byte local_181;
  uint local_128;
  int local_118;
  code *local_108;
  Window local_100;
  char local_c0 [32];
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  QSurfaceFormat local_70 [12];
  undefined1 local_64 [4];
  QList<int> local_60;
  int local_48;
  int local_44;
  QByteArray local_40;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  QSurfaceFormat local_10 [8];
  long local_8;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QPlatformOpenGLContext::QPlatformOpenGLContext(in_RDI);
  QNativeInterface::QGLXContext::QGLXContext((QGLXContext *)(in_RDI + 0x10));
  *(undefined ***)in_RDI = &PTR__QGLXContext_00119f58;
  *(undefined ***)(in_RDI + 0x10) = &PTR__QGLXContext_00119fd8;
  *(undefined8 *)(in_RDI + 0x18) = in_RSI;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  QSurfaceFormat::QSurfaceFormat((QSurfaceFormat *)(in_RDI + 0x38),in_RCX);
  in_RDI[0x40] = (QPlatformOpenGLContext)0x0;
  in_RDI[0x41] = (QPlatformOpenGLContext)0x1;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  in_RDI[0x50] = (QPlatformOpenGLContext)0x0;
  iVar5 = QSurfaceFormat::renderableType();
  iVar8 = (int)in_RDI;
  if (iVar5 == 0) {
    QOpenGLContext::openGLModuleType();
    QSurfaceFormat::setRenderableType(iVar8 + 0x38);
  }
  iVar5 = QSurfaceFormat::renderableType();
  if ((iVar5 != 1) && (iVar5 = QSurfaceFormat::renderableType(), iVar5 != 2)) goto LAB_0010a3e1;
  if (in_R8 != (QGLXContext *)0x0) {
    p_Var9 = glxContext(in_R8);
    *(GLXContext *)(in_RDI + 0x30) = p_Var9;
  }
  uVar17 = *(undefined8 *)(in_RDI + 0x18);
  iVar5 = QXcbScreen::screenNumber((QXcbScreen *)0x109591);
  QSurfaceFormat::QSurfaceFormat(local_10,(QSurfaceFormat *)(in_RDI + 0x38));
  dpy = (__GLXFBConfigRec *)qglx_findConfig(uVar17,iVar5,local_10,0);
  QSurfaceFormat::~QSurfaceFormat(local_10);
  *(__GLXFBConfigRec **)(in_RDI + 0x20) = dpy;
  local_100 = 0;
  if (dpy == (__GLXFBConfigRec *)0x0) {
    iVar8 = QSurfaceFormat::renderableType();
    iVar5 = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
    if (iVar8 == 2) goto LAB_0010a3e1;
    p_Var19 = *(_XDisplay **)(in_RDI + 0x18);
    iVar8 = QXcbScreen::screenNumber((QXcbScreen *)0x10a1ee);
    pQVar16 = (QSurfaceFormat *)
              qglx_findVisualInfo(p_Var19,iVar8,(QSurfaceFormat *)(in_RDI + 0x38),1,0);
    if (pQVar16 == (QSurfaceFormat *)0x0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 (char *)in_stack_fffffffffffffde8,iVar5,
                 (char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      QMessageLogger::fatal(local_c0,"Could not initialize GLX");
    }
    uVar17 = glXCreateContext(*(undefined8 *)(in_RDI + 0x18),pQVar16,*(undefined8 *)(in_RDI + 0x30),
                              1);
    *(undefined8 *)(in_RDI + 0x28) = uVar17;
    if ((*(long *)(in_RDI + 0x28) == 0) && (*(long *)(in_RDI + 0x30) != 0)) {
      *(undefined8 *)(in_RDI + 0x30) = 0;
      uVar17 = glXCreateContext(*(undefined8 *)(in_RDI + 0x18),pQVar16,0,1);
      *(undefined8 *)(in_RDI + 0x28) = uVar17;
    }
    in_stack_fffffffffffffde8 = pQVar16;
    QXcbScreen::screenNumber((QXcbScreen *)0x10a305);
    QXcbScreen::root((QXcbScreen *)0x10a316);
    local_100 = createDummyWindow(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,iVar6,
                                  in_stack_fffffffffffffe20);
    XFree(pQVar16);
  }
  else {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    uVar17 = *(undefined8 *)(in_RDI + 0x18);
    iVar5 = QXcbScreen::screenNumber((QXcbScreen *)0x109687);
    pcVar10 = (char *)glXQueryExtensionsString(uVar17,iVar5);
    QByteArray::QByteArray(&local_40,pcVar10,-1);
    QByteArray::split((char)&local_28);
    QByteArray::~QByteArray((QByteArray *)0x1096d4);
    local_108 = (code *)0x0;
    bVar1 = QListSpecialMethodsBase<QByteArray>::contains<char[23]>
                      (in_stack_fffffffffffffde0,
                       (char (*) [23])CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8))
    ;
    if (bVar1) {
      local_108 = (code *)glXGetProcAddress("glXCreateContextAttribsARB");
    }
    bVar1 = QListSpecialMethodsBase<QByteArray>::contains<char[31]>
                      (in_stack_fffffffffffffde0,
                       (char (*) [31])CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8))
    ;
    bVar2 = QListSpecialMethodsBase<QByteArray>::contains<char[34]>
                      (in_stack_fffffffffffffde0,
                       (char (*) [34])CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8))
    ;
    bVar3 = QListSpecialMethodsBase<QByteArray>::contains<char[37]>
                      (in_stack_fffffffffffffde0,
                       (char (*) [37])CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8))
    ;
    iVar5 = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
    if (local_108 != (code *)0x0) {
      iVar6 = QSurfaceFormat::renderableType();
      iVar5 = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
      if (iVar6 == 2) {
        if (bVar1) {
          bVar4 = QListSpecialMethodsBase<QByteArray>::contains<char[35]>
                            (in_stack_fffffffffffffde0,
                             (char (*) [35])
                             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          iVar5 = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
          if (bVar4) goto LAB_001097b5;
        }
      }
      else {
LAB_001097b5:
        iVar5 = QSurfaceFormat::majorVersion();
        local_44 = QSurfaceFormat::minorVersion();
        local_48 = 9;
        piVar11 = qMin<int>(&local_44,&local_48);
        iVar6 = iVar5 * 10 + *piVar11;
        local_60.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_60.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
        local_60.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QList<int>::QList((QList<int> *)0x109855);
        iVar5 = QSurfaceFormat::renderableType();
        if (iVar5 == 1) {
          if (0x2e < iVar6) {
            QList<int>::operator<<
                      ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
          }
          QList<int>::operator<<((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
          QList<int>::operator<<((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
          QList<int>::operator<<((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
          QList<int>::operator<<((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
          QList<int>::operator<<((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
          QList<int>::operator<<((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
          QList<int>::operator<<((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
          QList<int>::operator<<((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
          QList<int>::operator<<((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
          QList<int>::operator<<((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
          QList<int>::operator<<((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
          QList<int>::operator<<((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
          QList<int>::operator<<((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
        }
        else {
          iVar5 = QSurfaceFormat::renderableType();
          if (iVar5 == 2) {
            if (0x20 < iVar6) {
              QList<int>::operator<<
                        ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
            }
            QList<int>::operator<<
                      ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
            QList<int>::operator<<
                      ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
            QList<int>::operator<<
                      ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
            QList<int>::operator<<
                      ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
            memset(local_64,0,4);
            QFlags<QSurfaceFormat::FormatOption>::QFlags
                      ((QFlags<QSurfaceFormat::FormatOption> *)0x1099e6);
            QSurfaceFormat::setOptions((QFlags *)(in_RDI + 0x38));
          }
        }
        local_181 = 0;
        if (in_R8 != (QGLXContext *)0x0) {
          (**(code **)(*(long *)in_R8 + 0x18))(local_70);
          local_181 = QSurfaceFormat::testOption((FormatOption)local_70);
          QSurfaceFormat::~QSurfaceFormat(local_70);
        }
        if ((local_181 & 1) != 0) {
          QSurfaceFormat::setOption(iVar8 + 0x38,true);
        }
        local_118 = 0;
        while( true ) {
          bVar4 = false;
          if (*(long *)(in_RDI + 0x28) == 0) {
            qVar12 = QList<int>::size(&local_60);
            bVar4 = local_118 < qVar12;
          }
          iVar5 = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
          if (!bVar4) break;
          piVar13 = QList<int>::operator[]
                              ((QList<int> *)in_stack_fffffffffffffde0,
                               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          iVar5 = *piVar13;
          if (iVar5 <= iVar6) {
            local_88 = &DAT_aaaaaaaaaaaaaaaa;
            local_80 = &DAT_aaaaaaaaaaaaaaaa;
            local_78 = &DAT_aaaaaaaaaaaaaaaa;
            QList<int>::QList((QList<int> *)0x109ba2);
            QList<int>::operator<<
                      ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
            QList<int>::operator<<
                      ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
            QList<int>::operator<<
                      ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
            QList<int>::operator<<
                      ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
            iVar7 = QSurfaceFormat::renderableType();
            if (iVar7 == 1) {
              if ((0x1f < iVar5) && (bVar1)) {
                iVar7 = QSurfaceFormat::profile();
                if (iVar7 == 1) {
                  QList<int>::operator<<
                            ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
                  QList<int>::operator<<
                            ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
                }
                else {
                  QList<int>::operator<<
                            ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
                  QList<int>::operator<<
                            ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
                }
              }
              local_128 = 0;
              if (bVar2) {
                local_128 = 4;
              }
              uVar14 = QSurfaceFormat::testOption(iVar8 + 0x38);
              if ((uVar14 & 1) != 0) {
                local_128 = local_128 | 1;
              }
              if ((0x1d < iVar5) &&
                 (uVar14 = QSurfaceFormat::testOption(iVar8 + 0x38), (uVar14 & 1) == 0)) {
                local_128 = local_128 | 2;
              }
              if (local_128 != 0) {
                QList<int>::operator<<
                          ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
                QList<int>::operator<<
                          ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
              }
            }
            else {
              iVar5 = QSurfaceFormat::renderableType();
              if (iVar5 == 2) {
                QList<int>::operator<<
                          ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
                QList<int>::operator<<
                          ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
              }
            }
            if ((bVar2) && (uVar14 = QSurfaceFormat::testOption(iVar8 + 0x38), (uVar14 & 1) != 0)) {
              local_a0 = &DAT_aaaaaaaaaaaaaaaa;
              local_98 = &DAT_aaaaaaaaaaaaaaaa;
              local_90 = &DAT_aaaaaaaaaaaaaaaa;
              QList<int>::QList((QList<int> *)in_stack_fffffffffffffde0,
                                (QList<int> *)
                                CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
              QList<int>::operator<<
                        ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
              QList<int>::operator<<
                        ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
              if (bVar3) {
                QList<int>::operator<<
                          ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
                QList<int>::operator<<
                          ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
              }
              QList<int>::operator<<
                        ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
              uVar17 = *(undefined8 *)(in_RDI + 0x18);
              uVar18 = *(undefined8 *)(in_RDI + 0x30);
              piVar15 = QList<int>::data((QList<int> *)in_stack_fffffffffffffde0);
              uVar17 = (*local_108)(uVar17,dpy,uVar18,1,piVar15);
              *(undefined8 *)(in_RDI + 0x28) = uVar17;
              QList<int>::~QList((QList<int> *)0x109ea4);
            }
            if (*(long *)(in_RDI + 0x28) == 0) {
              QList<int>::operator<<
                        ((QList<int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
              uVar17 = *(undefined8 *)(in_RDI + 0x18);
              uVar18 = *(undefined8 *)(in_RDI + 0x30);
              p_Var20 = dpy;
              piVar15 = QList<int>::data((QList<int> *)in_stack_fffffffffffffde0);
              uVar17 = (*local_108)(uVar17,p_Var20,uVar18,1,piVar15);
              *(undefined8 *)(in_RDI + 0x28) = uVar17;
              if ((*(long *)(in_RDI + 0x28) == 0) && (*(long *)(in_RDI + 0x30) != 0)) {
                uVar17 = *(undefined8 *)(in_RDI + 0x18);
                p_Var20 = dpy;
                pcVar21 = local_108;
                piVar15 = QList<int>::data((QList<int> *)in_stack_fffffffffffffde0);
                uVar17 = (*pcVar21)(uVar17,p_Var20,0,1,piVar15);
                *(undefined8 *)(in_RDI + 0x28) = uVar17;
                if (*(long *)(in_RDI + 0x28) != 0) {
                  *(undefined8 *)(in_RDI + 0x30) = 0;
                }
              }
            }
            else {
              uVar17 = (**(code **)(*(long *)in_RDI + 0x60))(in_RDI,"glGetGraphicsResetStatusARB");
              *(undefined8 *)(in_RDI + 0x48) = uVar17;
            }
            QList<int>::~QList((QList<int> *)0x109fff);
          }
          local_118 = local_118 + 1;
        }
        QList<int>::~QList((QList<int> *)0x10a022);
      }
    }
    if (*(long *)(in_RDI + 0x28) == 0) {
      iVar8 = QSurfaceFormat::renderableType();
      if (iVar8 != 2) {
        uVar17 = glXCreateNewContext(*(undefined8 *)(in_RDI + 0x18),dpy,0x8014,
                                     *(undefined8 *)(in_RDI + 0x30),1);
        *(undefined8 *)(in_RDI + 0x28) = uVar17;
        if ((*(long *)(in_RDI + 0x28) == 0) && (*(long *)(in_RDI + 0x30) != 0)) {
          uVar17 = glXCreateNewContext(*(undefined8 *)(in_RDI + 0x18),dpy,0x8014,0,1);
          *(undefined8 *)(in_RDI + 0x28) = uVar17;
          if (*(long *)(in_RDI + 0x28) != 0) {
            *(undefined8 *)(in_RDI + 0x30) = 0;
          }
        }
        goto LAB_0010a0fa;
      }
      bVar1 = true;
    }
    else {
LAB_0010a0fa:
      if (*(long *)(in_RDI + 0x28) != 0) {
        qglx_surfaceFormatFromGLXFBConfig
                  ((QSurfaceFormat *)(in_RDI + 0x38),*(_XDisplay **)(in_RDI + 0x18),dpy,0);
      }
      config_00 = *(GLXFBConfig *)(in_RDI + 0x18);
      QXcbScreen::screenNumber((QXcbScreen *)0x10a156);
      QXcbScreen::root((QXcbScreen *)0x10a167);
      local_100 = createDummyWindow((Display *)dpy,config_00,iVar5,
                                    CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      bVar1 = false;
    }
    QList<QByteArray>::~QList((QList<QByteArray> *)0x10a19e);
    if (bVar1) goto LAB_0010a3e1;
  }
  if ((*(long *)(in_RDI + 0x28) != 0) && (local_100 != 0)) {
    uVar17 = glXGetCurrentContext();
    uVar18 = glXGetCurrentDrawable();
    glXMakeCurrent(*(undefined8 *)(in_RDI + 0x18),local_100,*(undefined8 *)(in_RDI + 0x28));
    updateFormatFromContext(in_stack_fffffffffffffde8);
    glXMakeCurrent(*(undefined8 *)(in_RDI + 0x18),uVar18,uVar17);
  }
  XDestroyWindow(*(undefined8 *)(in_RDI + 0x18),local_100);
LAB_0010a3e1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QGLXContext::QGLXContext(Display *display, QXcbScreen *screen, const QSurfaceFormat &format, QPlatformOpenGLContext *share)
    : QPlatformOpenGLContext()
    , m_display(display)
    , m_format(format)
    , m_ownsContext(true)
{
    if (m_format.renderableType() == QSurfaceFormat::DefaultRenderableType)
        m_format.setRenderableType(QOpenGLContext::openGLModuleType() == QOpenGLContext::LibGL
                                   ? QSurfaceFormat::OpenGL : QSurfaceFormat::OpenGLES);
    if (m_format.renderableType() != QSurfaceFormat::OpenGL && m_format.renderableType() != QSurfaceFormat::OpenGLES)
        return;

    if (share)
        m_shareContext = static_cast<const QGLXContext*>(share)->glxContext();

    GLXFBConfig config = qglx_findConfig(m_display, screen->screenNumber(), m_format);
    m_config = config;
    XVisualInfo *visualInfo = nullptr;
    Window window = 0; // Temporary window used to query OpenGL context

    if (config) {
        const QByteArrayList glxExt = QByteArray(glXQueryExtensionsString(m_display, screen->screenNumber())).split(' ');

        // Resolve entry point for glXCreateContextAttribsARB
        glXCreateContextAttribsARBProc glXCreateContextAttribsARB = nullptr;
        if (glxExt.contains("GLX_ARB_create_context"))
            glXCreateContextAttribsARB = (glXCreateContextAttribsARBProc) glXGetProcAddress((const GLubyte*)"glXCreateContextAttribsARB");

        const bool supportsProfiles = glxExt.contains("GLX_ARB_create_context_profile");
        const bool supportsRobustness = glxExt.contains("GLX_ARB_create_context_robustness");
        const bool supportsVideoMemoryPurge = glxExt.contains("GLX_NV_robustness_video_memory_purge");

        // Use glXCreateContextAttribsARB if available
        // Also, GL ES context creation requires GLX_EXT_create_context_es2_profile
        if (glXCreateContextAttribsARB != nullptr
                && (m_format.renderableType() != QSurfaceFormat::OpenGLES || (supportsProfiles && glxExt.contains("GLX_EXT_create_context_es2_profile")))) {
            // Try to create an OpenGL context for each known OpenGL version in descending
            // order from the requested version.
            const int requestedVersion = m_format.majorVersion() * 10 + qMin(m_format.minorVersion(), 9);

            QList<int> glVersions;
            if (m_format.renderableType() == QSurfaceFormat::OpenGL) {
                if (requestedVersion > 46)
                    glVersions << requestedVersion;

                // Don't bother with versions below 2.0
                glVersions << 46 << 45 << 44 << 43 << 42 << 41 << 40 << 33 << 32 << 31 << 30 << 21 << 20;
            } else if (m_format.renderableType() == QSurfaceFormat::OpenGLES) {
                if (requestedVersion > 32)
                    glVersions << requestedVersion;

                // Don't bother with versions below ES 2.0
                glVersions << 32 << 31 << 30 << 20;
                // ES does not support any format option
                m_format.setOptions(QSurfaceFormat::FormatOptions());
            }
            // Robustness must match that of the shared context.
            if (share && share->format().testOption(QSurfaceFormat::ResetNotification))
                m_format.setOption(QSurfaceFormat::ResetNotification);
            Q_ASSERT(glVersions.size() > 0);

            for (int i = 0; !m_context && i < glVersions.size(); i++) {
                const int version = glVersions[i];
                if (version > requestedVersion)
                    continue;

                const int majorVersion = version / 10;
                const int minorVersion = version % 10;

                QList<int> contextAttributes;
                contextAttributes << GLX_CONTEXT_MAJOR_VERSION_ARB << majorVersion
                                  << GLX_CONTEXT_MINOR_VERSION_ARB << minorVersion;


                if (m_format.renderableType() == QSurfaceFormat::OpenGL) {
                    // If asking for OpenGL 3.2 or newer we should also specify a profile
                    if (version >= 32 && supportsProfiles) {
                        if (m_format.profile() == QSurfaceFormat::CoreProfile)
                            contextAttributes << GLX_CONTEXT_PROFILE_MASK_ARB << GLX_CONTEXT_CORE_PROFILE_BIT_ARB;
                        else
                            contextAttributes << GLX_CONTEXT_PROFILE_MASK_ARB << GLX_CONTEXT_COMPATIBILITY_PROFILE_BIT_ARB;
                    }

                    int flags = 0;

                    if (supportsRobustness)
                        flags |= GLX_CONTEXT_ROBUST_ACCESS_BIT_ARB;

                    if (m_format.testOption(QSurfaceFormat::DebugContext))
                        flags |= GLX_CONTEXT_DEBUG_BIT_ARB;

                    // A forward-compatible context may be requested for 3.0 and later
                    if (version >= 30 && !m_format.testOption(QSurfaceFormat::DeprecatedFunctions))
                        flags |= GLX_CONTEXT_FORWARD_COMPATIBLE_BIT_ARB;

                    if (flags != 0)
                        contextAttributes << GLX_CONTEXT_FLAGS_ARB << flags;
                } else if (m_format.renderableType() == QSurfaceFormat::OpenGLES) {
                    contextAttributes << GLX_CONTEXT_PROFILE_MASK_ARB << GLX_CONTEXT_ES2_PROFILE_BIT_EXT;
                }

                if (supportsRobustness && m_format.testOption(QSurfaceFormat::ResetNotification)) {
                    QList<int> contextAttributesWithRobustness = contextAttributes;
                    contextAttributesWithRobustness << GLX_CONTEXT_RESET_NOTIFICATION_STRATEGY_ARB << GLX_LOSE_CONTEXT_ON_RESET_ARB;
                    if (supportsVideoMemoryPurge)
                        contextAttributesWithRobustness << GLX_GENERATE_RESET_ON_VIDEO_MEMORY_PURGE_NV << GL_TRUE;

                    contextAttributesWithRobustness << None;
                    m_context = glXCreateContextAttribsARB(m_display, config, m_shareContext, true,
                                                           contextAttributesWithRobustness.data());
                    // Context creation against a shared context may fail specifically due to this request, so try
                    // without before dropping sharing.
                }

                if (m_context) {
                    m_getGraphicsResetStatus = reinterpret_cast<GLenum (QOPENGLF_APIENTRYP)()>(getProcAddress("glGetGraphicsResetStatusARB"));
                } else {
                    contextAttributes << None;
                    m_context = glXCreateContextAttribsARB(m_display, config, m_shareContext, true, contextAttributes.data());
                    if (!m_context && m_shareContext) {
                        // re-try without a shared glx context
                        m_context = glXCreateContextAttribsARB(m_display, config, nullptr, true, contextAttributes.data());
                        if (m_context)
                            m_shareContext = nullptr;
                    }
                }
            }
        }

        // Could not create a context using glXCreateContextAttribsARB, falling back to glXCreateNewContext.
        if (!m_context) {
            // requesting an OpenGL ES context requires glXCreateContextAttribsARB, so bail out
            if (m_format.renderableType() == QSurfaceFormat::OpenGLES)
                return;

            m_context = glXCreateNewContext(m_display, config, GLX_RGBA_TYPE, m_shareContext, true);
            if (!m_context && m_shareContext) {
                // re-try without a shared glx context
                m_context = glXCreateNewContext(m_display, config, GLX_RGBA_TYPE, nullptr, true);
                if (m_context)
                    m_shareContext = nullptr;
            }
        }

        // Get the basic surface format details
        if (m_context)
            qglx_surfaceFormatFromGLXFBConfig(&m_format, m_display, config);

        // Create a temporary window so that we can make the new context current
        window = createDummyWindow(m_display, config, screen->screenNumber(), screen->root());
    } else {
        // requesting an OpenGL ES context requires glXCreateContextAttribsARB, so bail out
        if (m_format.renderableType() == QSurfaceFormat::OpenGLES)
            return;

        // Note that m_format gets updated with the used surface format
        visualInfo = qglx_findVisualInfo(m_display, screen->screenNumber(), &m_format);
        if (Q_UNLIKELY(!visualInfo))
            qFatal("Could not initialize GLX");
        m_context = glXCreateContext(m_display, visualInfo, m_shareContext, true);
        if (!m_context && m_shareContext) {
            // re-try without a shared glx context
            m_shareContext = nullptr;
            m_context = glXCreateContext(m_display, visualInfo, nullptr, true);
        }

        // Create a temporary window so that we can make the new context current
        window = createDummyWindow(m_display, visualInfo, screen->screenNumber(), screen->root());
        XFree(visualInfo);
    }

    // Query the OpenGL version and profile
    if (m_context && window) {
        GLXContext prevContext = glXGetCurrentContext();
        GLXDrawable prevDrawable = glXGetCurrentDrawable();
        glXMakeCurrent(m_display, window, m_context);
        updateFormatFromContext(m_format);

        // Make our context non-current
        glXMakeCurrent(m_display, prevDrawable, prevContext);
    }

    // Destroy our temporary window
    XDestroyWindow(m_display, window);
}